

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O3

void __thiscall
absl::AbslStringify<absl::strings_internal::StringifySink>(absl *this,StringifySink *sink,Hex hex)

{
  undefined4 *puVar1;
  long lVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  string_view v;
  char buffer [32];
  undefined4 local_18 [4];
  char local_8 [8];
  
  lVar2 = 0x38;
  puVar1 = local_18;
  do {
    *(undefined2 *)puVar1 =
         *(undefined2 *)
          (numbers_internal::kHexTable + ((ulong)sink >> ((byte)lVar2 & 0x3f) & 0xff) * 2);
    lVar2 = lVar2 + -8;
    puVar1 = (undefined4 *)((long)puVar1 + 2);
  } while (lVar2 != -8);
  lVar2 = 0x3f;
  if (((ulong)sink | 1) != 0) {
    for (; ((ulong)sink | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar3 = (ulong)(0x10 - (((uint)lVar2 ^ 0x3c) >> 2));
  if (uVar3 < (byte)hex.value) {
    auVar5 = ZEXT616(CONCAT42(CONCAT31(CONCAT21(CONCAT11(hex.value._3_1_,hex.value._3_1_),
                                                hex.value._2_1_),hex.value._2_1_),
                              CONCAT11(hex.value._1_1_,hex.value._1_1_)));
    auVar5 = pshuflw(auVar5,auVar5,0);
    uVar4 = auVar5._0_4_;
    lVar2 = -uVar3;
    *(undefined4 *)((long)local_18 + lVar2) = uVar4;
    *(undefined4 *)((long)local_18 + lVar2 + 4) = uVar4;
    *(undefined4 *)((long)local_18 + lVar2 + 8) = uVar4;
    *(undefined4 *)((long)local_18 + lVar2 + 0xc) = uVar4;
    uVar3 = (ulong)(byte)hex.value;
  }
  v._M_str = local_8 + -uVar3;
  v._M_len = uVar3;
  strings_internal::StringifySink::Append((StringifySink *)this,v);
  return;
}

Assistant:

void AbslStringify(S& sink, Hex hex) {
    static_assert(
        numbers_internal::kFastToBufferSize >= 32,
        "This function only works when output buffer >= 32 bytes long");
    char buffer[numbers_internal::kFastToBufferSize];
    char* const end = &buffer[numbers_internal::kFastToBufferSize];
    auto real_width =
        absl::numbers_internal::FastHexToBufferZeroPad16(hex.value, end - 16);
    if (real_width >= hex.width) {
      sink.Append(absl::string_view(end - real_width, real_width));
    } else {
      // Pad first 16 chars because FastHexToBufferZeroPad16 pads only to 16 and
      // max pad width can be up to 20.
      std::memset(end - 32, hex.fill, 16);
      // Patch up everything else up to the real_width.
      std::memset(end - real_width - 16, hex.fill, 16);
      sink.Append(absl::string_view(end - hex.width, hex.width));
    }
  }